

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O1

void __thiscall
QNetworkAccessBackendFactory::QNetworkAccessBackendFactory(QNetworkAccessBackendFactory *this)

{
  Type *this_00;
  long in_FS_OFFSET;
  QNetworkAccessBackendFactory *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject((QObject *)this,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_002cf598;
  if (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>::guard._q_value.
                 super___atomic_base<signed_char>._M_i) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_>::instance();
    this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_>::
              instance();
    local_20 = this;
    QtPrivate::QPodArrayOps<QNetworkAccessBackendFactory*>::emplace<QNetworkAccessBackendFactory*&>
              ((QPodArrayOps<QNetworkAccessBackendFactory*> *)this_00,
               (this_00->super_QList<QNetworkAccessBackendFactory_*>).d.size,
               (QNetworkAccessBackendFactory **)&local_20);
    QList<QNetworkAccessBackendFactory_*>::end
              (&this_00->super_QList<QNetworkAccessBackendFactory_*>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkAccessBackendFactory::QNetworkAccessBackendFactory()
{
    if (factoryData())
        factoryData->append(this);
}